

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O3

void __thiscall
Assimp::IFC::Schema_2x3::IfcTransportElement::~IfcTransportElement(IfcTransportElement *this)

{
  undefined1 *this_00;
  undefined1 *puVar1;
  
  this_00 = &this[-1].super_IfcElement.super_IfcProduct.super_IfcObject.field_0x70;
  *(undefined8 *)&this[-1].super_IfcElement.super_IfcProduct.super_IfcObject.field_0x70 = 0x934b50;
  *(undefined8 *)&(this->super_IfcElement).super_IfcProduct.super_IfcObject.field_0x58 = 0x934c40;
  *(undefined8 *)&this[-1].super_IfcElement.super_IfcProduct.Representation.have = 0x934b78;
  *(undefined8 *)&this[-1].super_IfcElement.super_IfcProduct.field_0x108 = 0x934ba0;
  *(undefined8 *)&this[-1].super_IfcElement.field_0x140 = 0x934bc8;
  this[-1].CapacityByWeight.ptr = 4.76933030253539e-317;
  *(undefined8 *)&(this->super_IfcElement).super_IfcProduct.super_IfcObject = 0x934c18;
  puVar1 = *(undefined1 **)&(this->super_IfcElement).super_IfcProduct.super_IfcObject.field_0x10;
  if (puVar1 != &(this->super_IfcElement).super_IfcProduct.super_IfcObject.field_0x20) {
    operator_delete(puVar1);
  }
  IfcElement::~IfcElement((IfcElement *)this_00,&PTR_construction_vtable_24__00934c58);
  operator_delete(this_00);
  return;
}

Assistant:

IfcTransportElement() : Object("IfcTransportElement") {}